

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  size_t __n;
  bool bVar1;
  _Alloc_hider _Var2;
  int iVar3;
  JsonTokenType JVar4;
  long lVar5;
  int *piVar6;
  runtime_error *prVar7;
  long lVar8;
  char **ppcVar9;
  double dVar10;
  string arg;
  queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
  types;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  istringstream test;
  allocator local_2b9;
  char **local_2b8;
  JsonTokenType local_2ac;
  JsonToken local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  char *local_260;
  _Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_> local_258;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if (2 < argc) {
    std::__cxx11::string::string((string *)&local_258,argv[1],(allocator *)&local_208);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_258,_S_in);
    if ((iterator *)local_258._M_impl.super__Deque_impl_data._M_map !=
        &local_258._M_impl.super__Deque_impl_data._M_start) {
      operator_delete(local_258._M_impl.super__Deque_impl_data._M_map);
    }
    local_258._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_258._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::_M_initialize_map
              (&local_258,0);
    local_208._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_208._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_2b8 = argv;
    std::
    _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_initialize_map(&local_208,0);
    lVar8 = 2;
    do {
      std::__cxx11::string::string((string *)&local_2a8,local_2b8[lVar8],(allocator *)&local_280);
      iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar3 == 0) {
        std::__cxx11::string::string((string *)&local_280,local_2b8[lVar8 + 1],&local_2b9);
        _Var2._M_p = local_280._M_dataplus._M_p;
        piVar6 = __errno_location();
        iVar3 = *piVar6;
        *piVar6 = 0;
        lVar5 = strtol(_Var2._M_p,&local_260,10);
        if (local_260 == _Var2._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else {
          JVar4 = (JsonTokenType)lVar5;
          if (((int)JVar4 == lVar5) && (*piVar6 != 0x22)) {
            if (*piVar6 == 0) {
              *piVar6 = iVar3;
            }
            local_2ac = JVar4;
            if (local_258._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_258._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::
              _M_push_back_aux<json::JsonTokenType>
                        ((deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_> *)
                         &local_258,&local_2ac);
            }
            else {
              *local_258._M_impl.super__Deque_impl_data._M_finish._M_cur = JVar4;
              local_258._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_258._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            goto LAB_001025f5;
          }
        }
        std::__throw_out_of_range("stoi");
        goto LAB_00102903;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar3 != 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Invalid test arguments");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string
                ((string *)&local_280,local_2b8[lVar8 + 1],(allocator *)&local_260);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                 &local_280);
LAB_001025f5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if ((size_type *)CONCAT44(local_2a8._4_4_,local_2a8.type) != &local_2a8.value._M_string_length
         ) {
        operator_delete((undefined1 *)CONCAT44(local_2a8._4_4_,local_2a8.type));
      }
      lVar8 = lVar8 + 2;
    } while ((int)lVar8 < argc);
    do {
      json::JsonLexer::nextToken(&local_2a8,(istream *)local_1b0);
      if ((local_258._M_impl.super__Deque_impl_data._M_finish._M_cur ==
           local_258._M_impl.super__Deque_impl_data._M_start._M_cur) ||
         (*local_258._M_impl.super__Deque_impl_data._M_start._M_cur != local_2a8.type)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Wrong token type");
        goto LAB_001028a3;
      }
      if (local_258._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_258._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_258._M_impl.super__Deque_impl_data._M_start._M_first);
        local_258._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_258._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_258._M_impl.super__Deque_impl_data._M_start._M_last =
             local_258._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_258._M_impl.super__Deque_impl_data._M_start._M_first =
             local_258._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_258._M_impl.super__Deque_impl_data._M_start._M_node =
             local_258._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_258._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_258._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (local_2a8.type == EndOfFile) {
        bVar1 = false;
      }
      else {
        if (local_2a8.type == Number) {
          if (local_208._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_208._M_impl.super__Deque_impl_data._M_start._M_cur) {
            __nptr = ((local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p;
            piVar6 = __errno_location();
            iVar3 = *piVar6;
            *piVar6 = 0;
            ppcVar9 = (char **)strtod(__nptr,(char **)&local_280);
            _Var2._M_p = local_2a8.value._M_dataplus._M_p;
            if (local_280._M_dataplus._M_p == __nptr) goto LAB_0010290f;
            local_2b8 = ppcVar9;
            if (*piVar6 == 0) {
              *piVar6 = iVar3;
            }
            else if (*piVar6 == 0x22) goto LAB_0010291b;
            iVar3 = *piVar6;
            *piVar6 = 0;
            dVar10 = strtod(local_2a8.value._M_dataplus._M_p,(char **)&local_280);
            if (local_280._M_dataplus._M_p == _Var2._M_p) goto LAB_00102903;
            if (*piVar6 == 0) {
              *piVar6 = iVar3;
            }
            else if (*piVar6 == 0x22) goto LAB_00102927;
            if (((double)local_2b8 == dVar10) && (!NAN((double)local_2b8) && !NAN(dVar10))) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_208);
              goto LAB_00102791;
            }
          }
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Wrong number value");
LAB_001028a3:
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_00102791:
        bVar1 = true;
        if (local_2a8.type == String) {
          if (((local_208._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_208._M_impl.super__Deque_impl_data._M_start._M_cur) ||
              (__n = (local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_string_length,
              __n != local_2a8.value._M_string_length)) ||
             ((__n != 0 &&
              (iVar3 = bcmp(((local_208._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus
                            )._M_p,local_2a8.value._M_dataplus._M_p,__n), iVar3 != 0)))) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Wrong string value");
            goto LAB_001028a3;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_208);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8.value._M_dataplus._M_p != &local_2a8.value.field_2) {
        operator_delete(local_2a8.value._M_dataplus._M_p);
      }
      if (!bVar1) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_208);
        std::_Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::~_Deque_base
                  (&local_258);
        std::__cxx11::istringstream::~istringstream(local_1b0);
        std::ios_base::~ios_base(local_138);
        return 0;
      }
    } while( true );
  }
LAB_00102933:
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Provide sufficient arguments");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_00102903:
  std::__throw_invalid_argument("stod");
LAB_0010290f:
  std::__throw_invalid_argument("stod");
LAB_0010291b:
  std::__throw_out_of_range("stod");
LAB_00102927:
  std::__throw_out_of_range("stod");
  goto LAB_00102933;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 3)
        throw std::runtime_error("Provide sufficient arguments");

    std::istringstream test(argv[1]);
    std::queue<JsonTokenType> types;
    std::queue<std::string> values;

    // Read the correct types and values the lexer should generate when reading the JSON text.
    for (int i = 2; i < argc; i += 2)
    {
        std::string arg = argv[i];
        if (arg == "TYPE")
        {
            types.push(static_cast<JsonTokenType>(std::stoi(argv[i + 1])));
        }
        else if (arg == "VALUE")
        {
            values.push(argv[i + 1]);
        }
        else
        {
            throw std::runtime_error("Invalid test arguments");
        }
    }

    while (true)
    {
        JsonToken current = JsonLexer::nextToken(test);

        // Check that the lexer generated the correct type.
        if (types.empty() || types.front() != current.type)
            throw std::runtime_error("Wrong token type");
        types.pop();

        if (current.type == JsonTokenType::EndOfFile)
            break;

        if (current.type == JsonTokenType::Number)
        {
            // Check that the lexer generated the correct number.
            if (values.empty() || std::stod(values.front()) != std::stod(current.value))
                throw std::runtime_error("Wrong number value");
            values.pop();
        }

        if (current.type == JsonTokenType::String)
        {
            // Check that the lexer generated the correct string.
            if (values.empty() || values.front() != current.value)
                throw std::runtime_error("Wrong string value");
            values.pop();
        }
    }

    return 0;
}